

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_global_unescape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int n;
  int c;
  int len;
  int i;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue str;
  JSValueUnion p_00;
  JSValue in_stack_ffffffffffffff68;
  JSValue JVar4;
  JSContext *ctx_00;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  JSValue local_10;
  
  local_10 = JS_ToString((JSContext *)0x1b6572,in_stack_ffffffffffffff68);
  p_00 = local_10.u;
  JVar4 = local_10;
  iVar1 = JS_IsException(local_10);
  if (iVar1 == 0) {
    string_buffer_init((JSContext *)JVar4.tag,(StringBuffer *)JVar4.u.ptr,0);
    uVar2 = (uint)*(undefined8 *)((long)p_00.ptr + 4) & 0x7fffffff;
    for (iVar1 = 0; ctx_00 = (JSContext *)JVar4.tag, iVar1 < (int)uVar2; iVar1 = iVar1 + 1) {
      in_stack_ffffffffffffff7c = string_get((JSString *)p_00.ptr,iVar1);
      if (in_stack_ffffffffffffff7c == 0x25) {
        if ((((int)uVar2 < iVar1 + 6) ||
            (iVar3 = string_get((JSString *)p_00.ptr,iVar1 + 1), iVar3 != 0x75)) ||
           (in_stack_ffffffffffffff78 =
                 string_get_hex((JSString *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                JVar4.tag._4_4_,(int)JVar4.tag), in_stack_ffffffffffffff78 < 0)) {
          if ((iVar1 + 3 <= (int)uVar2) &&
             (in_stack_ffffffffffffff78 =
                   string_get_hex((JSString *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                                  JVar4.tag._4_4_,(int)JVar4.tag), -1 < in_stack_ffffffffffffff78))
          {
            iVar1 = iVar1 + 2;
            in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78;
          }
        }
        else {
          iVar1 = iVar1 + 5;
          in_stack_ffffffffffffff7c = in_stack_ffffffffffffff78;
        }
      }
      string_buffer_putc16((StringBuffer *)JVar4.u.ptr,0);
    }
    JVar4.u._4_4_ = in_stack_ffffffffffffff7c;
    JVar4.u.int32 = in_stack_ffffffffffffff78;
    JVar4.tag._0_4_ = uVar2;
    JVar4.tag._4_4_ = iVar1;
    JS_FreeValue(ctx_00,JVar4);
    local_10 = string_buffer_end((StringBuffer *)ctx_00);
  }
  return local_10;
}

Assistant:

static JSValue js_global_unescape(JSContext *ctx, JSValueConst this_val,
                                  int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c, n;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);
    p = JS_VALUE_GET_STRING(str);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (c == '%') {
            if (i + 6 <= len
            &&  string_get(p, i + 1) == 'u'
            &&  (n = string_get_hex(p, i + 2, 4)) >= 0) {
                c = n;
                i += 6 - 1;
            } else
            if (i + 3 <= len
            &&  (n = string_get_hex(p, i + 1, 2)) >= 0) {
                c = n;
                i += 3 - 1;
            }
        }
        string_buffer_putc16(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}